

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O0

TestStatus *
vkt::api::anon_unknown_1::
multithreadedCreateSharedResourcesTest<vkt::api::(anonymous_namespace)::ComputePipeline>
          (TestStatus *__return_storage_ptr__,Context *context)

{
  Environment *this;
  deUint32 maxResourceConsumers_;
  CreateThread<vkt::api::(anonymous_namespace)::ComputePipeline> *this_00;
  DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread> local_151;
  MovePtr<vkt::api::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>
  local_150;
  uint local_140;
  deUint32 ndx;
  undefined1 local_130 [8];
  ThreadGroup threads;
  Resources res;
  Environment env;
  deUint32 numThreads;
  Context *context_local;
  TestStatus *local_10;
  
  local_10 = __return_storage_ptr__;
  maxResourceConsumers_ = getDefaultTestThreadCount();
  this = (Environment *)
         &res.pipelineCache.object.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.deleter.
          m_allocator;
  Environment::Environment(this,context,maxResourceConsumers_);
  ComputePipeline::Resources::Resources
            ((Resources *)&threads.m_barrier.m_numRemoved,this,
             (Parameters *)((long)&context_local + 7));
  ThreadGroup::ThreadGroup((ThreadGroup *)local_130);
  for (local_140 = 0; local_140 < maxResourceConsumers_; local_140 = local_140 + 1) {
    this_00 = (CreateThread<vkt::api::(anonymous_namespace)::ComputePipeline> *)operator_new(0x88);
    CreateThread<vkt::api::(anonymous_namespace)::ComputePipeline>::CreateThread
              (this_00,(Environment *)
                       &res.pipelineCache.object.super_RefBase<vk::Handle<(vk::HandleType)15>_>.
                        m_data.deleter.m_allocator,(Resources *)&threads.m_barrier.m_numRemoved,
               (Parameters *)((long)&context_local + 7));
    de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>::DefaultDeleter
              (&local_151);
    de::details::
    MovePtr<vkt::api::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>
    ::MovePtr(&local_150,this_00);
    ThreadGroup::add((ThreadGroup *)local_130,&local_150);
    de::details::
    MovePtr<vkt::api::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>
    ::~MovePtr(&local_150);
  }
  ThreadGroup::run(__return_storage_ptr__,(ThreadGroup *)local_130);
  ThreadGroup::~ThreadGroup((ThreadGroup *)local_130);
  ComputePipeline::Resources::~Resources((Resources *)&threads.m_barrier.m_numRemoved);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus multithreadedCreateSharedResourcesTest (Context& context, typename Object::Parameters params)
{
	const deUint32						numThreads	= getDefaultTestThreadCount();
	const Environment					env			(context, numThreads);
	const typename Object::Resources	res			(env, params);
	ThreadGroup							threads;

	for (deUint32 ndx = 0; ndx < numThreads; ndx++)
		threads.add(MovePtr<ThreadGroupThread>(new CreateThread<Object>(env, res, params)));

	return threads.run();
}